

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O3

int encodeLatLonToMapcodes_internal
              (Mapcodes *mapcodes,double lat,double lon,Territory territoryContext,
              int stop_with_one_result,int requiredEncoder,int extraDigits)

{
  MapcodeError MVar1;
  int iVar2;
  uint uVar3;
  Territory ccode;
  Territory in_R9D;
  int iVar4;
  uint uVar5;
  EncodeRec enc;
  EncodeRec local_50;
  Mapcodes *local_38;
  
  mapcodes->count = 0;
  local_50.mapcodes = mapcodes;
  MVar1 = convertCoordsToMicrosAndFractions
                    (&local_50.coord32,&local_50.fraclat,&local_50.fraclon,lat,lon);
  if (MVar1 < ERR_OK) {
    iVar2 = 0;
  }
  else {
    local_38 = mapcodes;
    if (territoryContext < _TERRITORY_MIN) {
      local_50.coord32.latMicroDeg = local_50.coord32.latMicroDeg + local_50.coord32.lonMicroDeg;
      iVar4 = 0;
      iVar2 = 1;
      uVar3 = 0x1ab0274;
      do {
        local_50.coord32.lonMicroDeg = local_50.coord32.latMicroDeg - local_50.coord32.lonMicroDeg;
        if ((int)uVar3 < local_50.coord32.lonMicroDeg) {
          iVar4 = REDIVAR[iVar2];
        }
        else {
          iVar4 = iVar4 + 2;
        }
        iVar2 = iVar4 + 1;
        uVar3 = REDIVAR[iVar4];
      } while (0x3ff < uVar3);
      uVar5 = 0;
      while( true ) {
        ccode = TERRITORY_AAA;
        if (uVar3 != uVar5) {
          ccode = REDIVAR[(int)(iVar4 + 1 + uVar5)];
        }
        encoderEngine(ccode,&local_50,stop_with_one_result,requiredEncoder,-1,in_R9D);
        if (((stop_with_one_result != 0) && (0 < (local_50.mapcodes)->count)) ||
           ((int)uVar3 <= (int)uVar5)) break;
        uVar5 = uVar5 + 1;
      }
    }
    else {
      encoderEngine(territoryContext,&local_50,stop_with_one_result,requiredEncoder,-1,in_R9D);
    }
    iVar2 = local_38->count;
  }
  return iVar2;
}

Assistant:

static int encodeLatLonToMapcodes_internal(Mapcodes *mapcodes,
                                           const double lat, const double lon,
                                           const enum Territory territoryContext, const int stop_with_one_result,
                                           const int requiredEncoder, const int extraDigits) {
    EncodeRec enc;
    enc.mapcodes = mapcodes;
    enc.mapcodes->count = 0;
    ASSERT(mapcodes);
    ASSERT((0 <= extraDigits) && (extraDigits <= MAX_PRECISION_DIGITS));

    if (convertCoordsToMicrosAndFractions(&enc.coord32, &enc.fraclat, &enc.fraclon, lat, lon) < 0) {
        return 0;
    }

    if (territoryContext < _TERRITORY_MIN) // ALL results?
    {

#ifndef NO_FAST_ENCODE
        {
            const int sum = enc.coord32.lonMicroDeg + enc.coord32.latMicroDeg;
            int coord = enc.coord32.lonMicroDeg;
            int i = 0; // pointer into REDIVAR
            for (;;) {
                const int r = REDIVAR[i++];
                if (r >= 0 && r < 1024) { // leaf?
                    int j;
                    for (j = 0; j <= r; j++) {
                        const enum Territory ccode = (j == r ? TERRITORY_AAA : (enum Territory) REDIVAR[i + j]);
                        encoderEngine(ccode, &enc, stop_with_one_result, extraDigits, requiredEncoder, TERRITORY_NONE);
                        if ((stop_with_one_result || (requiredEncoder >= 0)) && (enc.mapcodes->count > 0)) {
                            break;
                        }
                    }
                    break;
                } else {
                    coord = sum - coord;
                    if (coord > r) {
                        i = REDIVAR[i];
                    } else {
                        i++;
                    }
                }
            }
        }
#else
        {
            int i;
            for (i = _TERRITORY_MIN + 1; i < _TERRITORY_MAX; i++) {
                encoderEngine((enum Territory) i, &enc, stop_with_one_result, extraDigits, requiredEncoder, TERRITORY_NONE);
                if ((stop_with_one_result || (requiredEncoder >= 0)) && (enc.mapcodes->count > 0)) {
                    break;
                }
            }
        }
#endif

    } else {
        encoderEngine(territoryContext, &enc, stop_with_one_result, extraDigits, requiredEncoder, TERRITORY_NONE);
    }
    return mapcodes->count;
}